

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O3

Type * __thiscall
slang::ast::builtins::StochasticTask::checkArguments
          (StochasticTask *this,ASTContext *context,Args *args,SourceRange range,Expression *param_4
          )

{
  Compilation *pCVar1;
  bool bVar2;
  Type *pTVar3;
  size_t sVar4;
  size_t min;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  min = this->outputArgs + this->inputArgs;
  bVar2 = SystemSubroutine::checkArgCount
                    (&this->super_SystemSubroutine,context,false,args,range,min,min);
  if (bVar2) {
    if (min != 0) {
      sVar4 = 0;
      do {
        bVar2 = Type::isIntegral((args->_M_ptr[sVar4]->type).ptr);
        if (!bVar2) {
          pTVar3 = SystemSubroutine::badArg
                             (&this->super_SystemSubroutine,context,args->_M_ptr[sVar4]);
          return pTVar3;
        }
        sVar4 = sVar4 + 1;
      } while (min != sVar4);
    }
    if ((this->super_SystemSubroutine).kind == Function) {
      pTVar3 = pCVar1->intType;
    }
    else {
      pTVar3 = pCVar1->voidType;
    }
  }
  else {
    pTVar3 = pCVar1->errorType;
  }
  return pTVar3;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        size_t totalArgs = inputArgs + outputArgs;
        if (!checkArgCount(context, false, args, range, totalArgs, totalArgs))
            return comp.getErrorType();

        for (size_t i = 0; i < totalArgs; i++) {
            if (!args[i]->type->isIntegral())
                return badArg(context, *args[i]);
        }

        return kind == SubroutineKind::Function ? comp.getIntType() : comp.getVoidType();
    }